

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::UpsampleLayerParams::ByteSizeLong(UpsampleLayerParams *this)

{
  int iVar1;
  uint uVar2;
  UpsampleLayerParams_InterpolationMode UVar3;
  UpsampleLayerParams_LinearUpsampleMode UVar4;
  size_t sVar5;
  size_t sVar6;
  int cached_size;
  int cached_size_2;
  size_t data_size_1;
  uint count;
  int cached_size_1;
  size_t data_size;
  size_t total_size;
  UpsampleLayerParams *this_local;
  
  data_size = 0;
  sVar5 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->scalingfactor_);
  if (sVar5 != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar5);
    data_size = sVar6 + 1;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sVar5);
  this->_scalingfactor_cached_byte_size_ = iVar1;
  data_size = sVar5 + data_size;
  uVar2 = fractionalscalingfactor_size(this);
  sVar5 = (ulong)uVar2 * 4;
  if ((ulong)uVar2 != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar5);
    data_size = sVar6 + 1 + data_size;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sVar5);
  this->_fractionalscalingfactor_cached_byte_size_ = iVar1;
  data_size = sVar5 + data_size;
  UVar3 = mode(this);
  if (UVar3 != UpsampleLayerParams_InterpolationMode_NN) {
    UVar3 = mode(this);
    sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(UVar3);
    data_size = sVar5 + 1 + data_size;
  }
  UVar4 = linearupsamplemode(this);
  if (UVar4 != UpsampleLayerParams_LinearUpsampleMode_DEFAULT) {
    UVar4 = linearupsamplemode(this);
    sVar5 = google::protobuf::internal::WireFormatLite::EnumSize(UVar4);
    data_size = sVar5 + 1 + data_size;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(data_size);
  this->_cached_size_ = iVar1;
  return data_size;
}

Assistant:

size_t UpsampleLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.UpsampleLayerParams)
  size_t total_size = 0;

  // repeated uint64 scalingFactor = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->scalingfactor_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _scalingfactor_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated float fractionalScalingFactor = 7;
  {
    unsigned int count = this->fractionalscalingfactor_size();
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _fractionalscalingfactor_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.UpsampleLayerParams.InterpolationMode mode = 5;
  if (this->mode() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->mode());
  }

  // .CoreML.Specification.UpsampleLayerParams.LinearUpsampleMode linearUpsampleMode = 6;
  if (this->linearupsamplemode() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->linearupsamplemode());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}